

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtrimCollFunc(void *pUser,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = (long)nKey1;
  do {
    lVar4 = lVar1;
    if (lVar4 == 0) {
      lVar4 = 0;
      break;
    }
    lVar1 = lVar4 + -1;
  } while (*(char *)((long)pKey1 + lVar4 + -1) == ' ');
  lVar1 = (long)nKey2;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0) {
      iVar2 = binCollFunc(pUser,(int)lVar4,pKey1,0,pKey2);
      return iVar2;
    }
    lVar1 = lVar3 + -1;
  } while (*(char *)((long)pKey2 + lVar3 + -1) == ' ');
  iVar2 = binCollFunc(pUser,(int)lVar4,pKey1,(int)lVar3,pKey2);
  return iVar2;
}

Assistant:

static int rtrimCollFunc(
  void *pUser,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  const u8 *pK1 = (const u8*)pKey1;
  const u8 *pK2 = (const u8*)pKey2;
  while( nKey1 && pK1[nKey1-1]==' ' ) nKey1--;
  while( nKey2 && pK2[nKey2-1]==' ' ) nKey2--;
  return binCollFunc(pUser, nKey1, pKey1, nKey2, pKey2);
}